

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::CleanUpValueMaps(BasicBlock *this)

{
  ExprHash EVar1;
  Type TVar2;
  GlobOpt *pGVar3;
  JitArenaAllocator *pJVar4;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  BVSparse<Memory::JitArenaAllocator> *obj;
  Value *pVVar6;
  ValueInfo *this_01;
  JitArenaAllocator *pJVar7;
  ExprHashTable *pEVar8;
  long lVar9;
  code *pcVar10;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *pSVar11;
  bool bVar12;
  BOOLEAN BVar13;
  GlobOptBlockData *this_02;
  undefined4 *puVar14;
  Type *ppOVar15;
  StackSym *pSVar16;
  Type *pTVar17;
  StackSym *pSVar18;
  Type *pTVar19;
  Value *pVVar20;
  Sym *sym;
  long *plVar21;
  Type_conflict pBVar22;
  BVSparseNode *pBVar23;
  ulong uVar24;
  ArenaMemoryData *pAVar25;
  undefined1 auVar26 [8];
  uint uVar27;
  ArenaMemoryData *pAVar28;
  Type_conflict pBVar29;
  BVSparseNode *pBVar30;
  ulong uVar31;
  uint key;
  BVSparse<Memory::JitArenaAllocator> *pBVar32;
  bool bVar33;
  undefined1 auStack_118 [8];
  BVSparse<Memory::JitArenaAllocator> symsInCallSequence;
  BVSparse<Memory::JitArenaAllocator> keepAliveSymsBv;
  undefined1 auStack_c8 [8];
  BVSparse<Memory::JitArenaAllocator> availableValueNumbers;
  undefined1 auStack_98 [8];
  BVSparse<Memory::JitArenaAllocator> deadSymsBv;
  undefined1 auStack_68 [8];
  Iterator __iter;
  
  pGVar3 = (this->globOptData).globOpt;
  bVar12 = IsLandingPad(this);
  if ((bVar12) ||
     ((uint)(&DAT_015b5fd4)[(pGVar3->field_0xf7 & 2) >> 1] <= pGVar3->instrCountSinceLastCleanUp)) {
    this_02 = &this->globOptData;
    pGVar3->instrCountSinceLastCleanUp = 0;
    pJVar4 = pGVar3->tempAlloc;
    this_00 = this_02->symToValueMap;
    deadSymsBv.alloc = (Type)auStack_98;
    auStack_98 = (undefined1  [8])0x0;
    deadSymsBv.head = (Type_conflict)0x0;
    symsInCallSequence.lastUsedNodePrevNextField = (Type)0x0;
    availableValueNumbers.alloc = (Type)auStack_c8;
    auStack_c8 = (undefined1  [8])0x0;
    availableValueNumbers.head = (Type_conflict)0x0;
    pBVar5 = pGVar3->byteCodeConstantValueNumbersBv;
    availableValueNumbers.lastFoundIndex = (Type_conflict)pJVar4;
    deadSymsBv.lastFoundIndex = (Type_conflict)pJVar4;
    BVSparse<Memory::JitArenaAllocator>::AssertBV<Memory::JitArenaAllocator>(pBVar5);
    BVSparse<Memory::JitArenaAllocator>::CopyFromNode<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,pBVar5->head);
    availableValueNumbers.lastUsedNodePrevNextField = (Type)this->loop;
    pBVar5 = this->upwardExposedUses;
    obj = this->upwardExposedFields;
    symsInCallSequence.alloc = (Type)auStack_118;
    auStack_118 = (undefined1  [8])0x0;
    symsInCallSequence.head = (Type_conflict)0x0;
    pAVar28 = (ArenaMemoryData *)(this->globOptData).callSequence;
    symsInCallSequence.lastFoundIndex = (Type_conflict)pJVar4;
    pSVar11 = __iter.list;
    if ((pAVar28 != (ArenaMemoryData *)0x0) &&
       ((ArenaMemoryData *)((SListNodeBase<Memory::ArenaAllocator> *)&pAVar28->allocatedBytes)->next
        != pAVar28)) {
      auStack_68 = (undefined1  [8])pAVar28;
      __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)pAVar28;
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      while( true ) {
        if (__iter.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar12) goto LAB_004219cc;
          *puVar14 = 0;
        }
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        pSVar11 = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        if ((undefined1  [8])__iter.list == auStack_68) break;
        ppOVar15 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)auStack_68);
        pSVar16 = IR::Opnd::GetStackSym(*ppOVar15);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_118,(pSVar16->super_Sym).m_id);
      }
    }
    __iter.list = pSVar11;
    if (this_00->tableSize != 0) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar24 = 0;
      do {
        auStack_68 = (undefined1  [8])(this_00->table + uVar24);
        __iter.current = (NodeBase *)0x0;
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)auStack_68;
        while (bVar12 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                        EditingIterator::Next((EditingIterator *)auStack_68), bVar12) {
          pTVar17 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)auStack_68);
          pSVar16 = (StackSym *)pTVar17->value;
          BVar13 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar5,(pSVar16->super_Sym).m_id);
          bVar12 = true;
          if (BVar13 == '\0') {
            BVar13 = BVSparse<Memory::JitArenaAllocator>::Test(obj,(pSVar16->super_Sym).m_id);
            bVar12 = BVar13 != '\0';
          }
          if ((bVar12) ||
             (BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                 ((BVSparse<Memory::JitArenaAllocator> *)auStack_118,
                                  (pSVar16->super_Sym).m_id), BVar13 == '\0')) {
            if (availableValueNumbers.lastUsedNodePrevNextField == (Type)0x0) {
              bVar33 = false;
            }
            else {
              BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (this->loop->fieldPRESymStores,(pSVar16->super_Sym).m_id);
              bVar33 = BVar13 != '\0';
            }
            uVar27 = (pSVar16->super_Sym).m_id;
            pGVar3 = (this->globOptData).globOpt;
            if (((bVar12 || bVar33) || pGVar3->maxInitialSymID < uVar27) ||
               ((availableValueNumbers.lastUsedNodePrevNextField != (Type)0x0 &&
                (BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pGVar3->prePassCopyPropSym,uVar27), BVar13 != '\0')))) {
              if (((pSVar16->super_Sym).m_kind == SymKindProperty) &&
                 (BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                     ((this->globOptData).liveFields,(pSVar16->super_Sym).m_id),
                 pSVar11 = __iter.list, BVar13 == '\0')) {
                pJVar7 = this_00->alloc;
                SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::UnlinkCurrentNode((EditingIterator *)auStack_68);
                Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                          ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar7,pSVar11,0x18);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveInt32Syms,(pSVar16->super_Sym).m_id);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveLossyInt32Syms,(pSVar16->super_Sym).m_id);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveFloat64Syms,(pSVar16->super_Sym).m_id);
              }
              else {
                pVVar6 = pTVar17->element;
                pSVar18 = (StackSym *)pVVar6->valueInfo->symStore;
                if (((pSVar18 != pSVar16 && pSVar18 != (StackSym *)0x0) &&
                    (BVSparse<Memory::JitArenaAllocator>::Set
                               ((BVSparse<Memory::JitArenaAllocator> *)
                                &symsInCallSequence.lastUsedNodePrevNextField,
                                (pSVar18->super_Sym).m_id),
                    (pSVar18->super_Sym).m_kind == SymKindStack)) &&
                   (bVar12 = StackSym::HasObjectTypeSym(pSVar18), bVar12)) {
                  if ((pSVar18->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar14 = 1;
                    bVar12 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar12) goto LAB_004219cc;
                    *puVar14 = 0;
                  }
                  pSVar16 = StackSym::GetObjectTypeSym(pSVar18);
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)
                             &symsInCallSequence.lastUsedNodePrevNextField,(pSVar16->super_Sym).m_id
                            );
                }
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,pVVar6->valueNumber);
              }
            }
            else {
              pVVar6 = pTVar17->element;
              this_01 = pVVar6->valueInfo;
              pSVar18 = (StackSym *)this_01->symStore;
              if (pSVar18 == pSVar16 && pSVar18 != (StackSym *)0x0) {
                bVar12 = ValueInfo::IsVarConstant(this_01);
                if (((!bVar12) &&
                    (bVar12 = ValueInfo::HasIntConstantValue(pTVar17->element->valueInfo,false),
                    !bVar12)) &&
                   ((BVSparse<Memory::JitArenaAllocator>::Set
                               ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                                (pSVar16->super_Sym).m_id),
                    (pSVar16->super_Sym).m_kind == SymKindStack &&
                    (bVar12 = StackSym::HasObjectTypeSym(pSVar16), bVar12)))) {
                  if ((pSVar16->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar14 = 1;
                    bVar12 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar12) goto LAB_004219cc;
                    *puVar14 = 0;
                  }
                  pSVar16 = StackSym::GetObjectTypeSym(pSVar16);
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                             (pSVar16->super_Sym).m_id);
                }
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,pVVar6->valueNumber);
              }
              else {
                if (((pSVar16->super_Sym).m_kind == SymKindStack) &&
                   (bVar12 = StackSym::HasObjectTypeSym(pSVar16), bVar12)) {
                  if ((pSVar16->super_Sym).m_kind != SymKindStack) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar14 = 1;
                    bVar12 = Js::Throw::ReportAssert
                                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                        ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                    if (!bVar12) goto LAB_004219cc;
                    *puVar14 = 0;
                  }
                  pSVar18 = StackSym::GetObjectTypeSym(pSVar16);
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
                             (pSVar18->super_Sym).m_id);
                }
                pSVar11 = __iter.list;
                pJVar7 = this_00->alloc;
                SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::UnlinkCurrentNode((EditingIterator *)auStack_68);
                Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                          ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           pJVar7,pSVar11,0x18);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveInt32Syms,(pSVar16->super_Sym).m_id);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveLossyInt32Syms,(pSVar16->super_Sym).m_id);
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((this->globOptData).liveFloat64Syms,(pSVar16->super_Sym).m_id);
                GlobOptBlockData::SetChangedSym(this_02,(Sym *)pSVar16);
              }
            }
          }
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 < this_00->tableSize);
    }
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,
               (BVSparse<Memory::JitArenaAllocator> *)&symsInCallSequence.lastUsedNodePrevNextField)
    ;
    pEVar8 = (this->globOptData).exprToValueMap;
    availableValueNumbers.lastUsedNodePrevNextField =
         (Type)CONCAT71(availableValueNumbers.lastUsedNodePrevNextField._1_7_,
                        (this->globOptData).hasCSECandidates);
    (this->globOptData).hasCSECandidates = false;
    auVar26 = auStack_98;
    if (pEVar8->tableSize != 0) {
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar24 = 0;
      do {
        auStack_68 = (undefined1  [8])(pEVar8->table + uVar24);
        __iter.current = (NodeBase *)0x0;
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)auStack_68;
        while (bVar12 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        ::EditingIterator::Next((EditingIterator *)auStack_68), bVar12) {
          pTVar19 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)auStack_68);
          EVar1 = pTVar19->value;
          uVar27 = (uint)EVar1 >> 8 & 0x7ff;
          if (((uVar27 == 0) ||
              (BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,uVar27),
              BVar13 != '\0')) &&
             (((uVar27 = (uint)EVar1 >> 0x13 & 0x7ff, uVar27 == 0 ||
               (BVar13 = BVSparse<Memory::JitArenaAllocator>::Test
                                   ((BVSparse<Memory::JitArenaAllocator> *)auStack_c8,uVar27),
               BVar13 != '\0')) &&
              ((((pVVar6 = pTVar19->element, pVVar6 != (Value *)0x0 &&
                 (pSVar16 = (StackSym *)pVVar6->valueInfo->symStore, pSVar16 != (StackSym *)0x0)) &&
                (pVVar20 = GlobOptBlockData::FindValue(this_02,(Sym *)pSVar16),
                pVVar20 != (Value *)0x0)) && (pVVar20->valueNumber == pVVar6->valueNumber)))))) {
            BVSparse<Memory::JitArenaAllocator>::Clear
                      ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,(pSVar16->super_Sym).m_id);
            if (((pSVar16->super_Sym).m_kind == SymKindStack) &&
               (bVar12 = StackSym::HasObjectTypeSym(pSVar16), bVar12)) {
              if ((pSVar16->super_Sym).m_kind != SymKindStack) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar14 = 1;
                bVar12 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                    ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
                if (!bVar12) goto LAB_004219cc;
                *puVar14 = 0;
              }
              pSVar16 = StackSym::GetObjectTypeSym(pSVar16);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((BVSparse<Memory::JitArenaAllocator> *)auStack_98,(pSVar16->super_Sym).m_id
                        );
            }
            (this->globOptData).hasCSECandidates =
                 availableValueNumbers.lastUsedNodePrevNextField._0_1_;
          }
          else {
            pSVar11 = __iter.list;
            pJVar7 = pEVar8->alloc;
            SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::UnlinkCurrentNode((EditingIterator *)auStack_68);
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                      ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)pJVar7,
                       pSVar11,0x18);
          }
        }
        uVar24 = uVar24 + 1;
        auVar26 = auStack_98;
      } while (uVar24 < pEVar8->tableSize);
    }
    for (; auVar26 != (undefined1  [8])0x0;
        auVar26 = (undefined1  [8])((BVSparseNode *)auVar26)->next) {
      uVar24 = (((BVSparseNode *)auVar26)->data).word;
      if (uVar24 != 0) {
        TVar2 = ((BVSparseNode *)auVar26)->startIndex;
        uVar31 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
          }
        }
        do {
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar31);
          key = (BVIndex)uVar31 + TVar2;
          ValueHashTable<Sym_*,_Value_*>::Clear(this_00,key);
          sym = SymTable::Find(this->func->m_symTable,key);
          GlobOptBlockData::SetChangedSym(this_02,sym);
          uVar24 = uVar24 & ~(1L << (uVar31 & 0x3f));
          lVar9 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar31 = (ulong)(-(uint)(uVar24 == 0) | (uint)lVar9);
        } while (uVar24 != 0);
      }
    }
    plVar21 = (long *)auStack_98;
    do {
      plVar21 = (long *)*plVar21;
      if (plVar21 == (long *)0x0) goto LAB_00421819;
    } while (plVar21[2] == 0);
    if (plVar21 != (long *)0x0) {
      bVar12 = Func::IsJitInDebugMode(this->func);
      if (bVar12) {
        if (this->func->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x1133,"(this->func->m_nonTempLocalVars)",
                              "this->func->m_nonTempLocalVars");
          if (!bVar12) goto LAB_004219cc;
          *puVar14 = 0;
        }
        auStack_68 = (undefined1  [8])0x0;
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        __iter.current = (NodeBase *)pJVar4;
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,
                   (BVSparse<Memory::JitArenaAllocator> *)auStack_98,this->func->m_nonTempLocalVars)
        ;
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                  ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_68
                  );
        pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
        BVSparse<Memory::JitArenaAllocator>::And
                  (pBVar32,(this->globOptData).liveInt32Syms,this->func->m_nonTempLocalVars);
        do {
          pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)pBVar32->head;
          if (pBVar32 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_00421663;
        } while (((Type *)&pBVar32->alloc)->word == 0);
        if (pBVar32 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x1139,"(tempBv.IsEmpty())",
                              "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?"
                             );
          if (!bVar12) goto LAB_004219cc;
          *puVar14 = 0;
        }
LAB_00421663:
        pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
        BVSparse<Memory::JitArenaAllocator>::And
                  (pBVar32,(this->globOptData).liveLossyInt32Syms,this->func->m_nonTempLocalVars);
        do {
          pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)pBVar32->head;
          if (pBVar32 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004216f1;
        } while (((Type *)&pBVar32->alloc)->word == 0);
        if (pBVar32 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x113b,"(tempBv.IsEmpty())",
                              "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?"
                             );
          if (!bVar12) goto LAB_004219cc;
          *puVar14 = 0;
        }
LAB_004216f1:
        pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)auStack_68;
        BVSparse<Memory::JitArenaAllocator>::And
                  (pBVar32,(this->globOptData).liveFloat64Syms,this->func->m_nonTempLocalVars);
        do {
          pBVar32 = (BVSparse<Memory::JitArenaAllocator> *)pBVar32->head;
          if (pBVar32 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0042177f;
        } while (((Type *)&pBVar32->alloc)->word == 0);
        if (pBVar32 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                              ,0x113d,"(tempBv.IsEmpty())",
                              "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?"
                             );
          if (!bVar12) {
LAB_004219cc:
            pcVar10 = (code *)invalidInstructionException();
            (*pcVar10)();
          }
          *puVar14 = 0;
        }
LAB_0042177f:
        if (auStack_68 != (undefined1  [8])0x0) {
          auVar26 = auStack_68;
          pAVar28 = (ArenaMemoryData *)__iter.current[0x10].next;
          do {
            pAVar25 = (ArenaMemoryData *)auVar26;
            auVar26 = (undefined1  [8])
                      ((SListNodeBase<Memory::ArenaAllocator> *)&pAVar25->allocatedBytes)->next;
            ((SListNodeBase<Memory::ArenaAllocator> *)&pAVar25->allocatedBytes)->next =
                 (Type)pAVar28;
            pAVar28 = pAVar25;
          } while (auVar26 != (undefined1  [8])0x0);
          __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          __iter.current[0x10].next = (Type)pAVar25;
        }
      }
      else {
        BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                  ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_98
                  );
      }
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((this->globOptData).liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_98
                );
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((this->globOptData).liveLossyInt32Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
                ((this->globOptData).liveFloat64Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)auStack_98);
    }
LAB_00421819:
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,pBVar5);
    this->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,obj);
    this->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if (this->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (((this->globOptData).globOpt)->alloc,this->cloneStrCandidates);
      this->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    if (auStack_118 != (undefined1  [8])0x0) {
      pBVar29 = *(Type_conflict *)&symsInCallSequence.lastFoundIndex[5].startIndex;
      do {
        pBVar22 = (Type_conflict)auStack_118;
        auStack_118 = (undefined1  [8])pBVar22->next;
        pBVar22->next = pBVar29;
        pBVar29 = pBVar22;
      } while (auStack_118 != (undefined1  [8])0x0);
      *(Type_conflict *)&symsInCallSequence.lastFoundIndex[5].startIndex = pBVar22;
    }
    if (auStack_c8 != (undefined1  [8])0x0) {
      pBVar29 = *(Type_conflict *)&availableValueNumbers.lastFoundIndex[5].startIndex;
      do {
        pBVar22 = (Type_conflict)auStack_c8;
        auStack_c8 = (undefined1  [8])pBVar22->next;
        pBVar22->next = pBVar29;
        pBVar29 = pBVar22;
      } while (auStack_c8 != (undefined1  [8])0x0);
      *(Type_conflict *)&availableValueNumbers.lastFoundIndex[5].startIndex = pBVar22;
    }
    if (symsInCallSequence.lastUsedNodePrevNextField != (Type)0x0) {
      pBVar30 = pJVar4->bvFreeList;
      do {
        pBVar23 = (BVSparseNode *)symsInCallSequence.lastUsedNodePrevNextField;
        symsInCallSequence.lastUsedNodePrevNextField = &pBVar23->next->next;
        pBVar23->next = pBVar30;
        pBVar30 = pBVar23;
      } while ((Type)symsInCallSequence.lastUsedNodePrevNextField != (Type)0x0);
      pJVar4->bvFreeList = pBVar23;
    }
    if (auStack_98 != (undefined1  [8])0x0) {
      pBVar30 = *(BVSparseNode **)&deadSymsBv.lastFoundIndex[5].startIndex;
      do {
        pBVar23 = (BVSparseNode *)auStack_98;
        auStack_98 = (undefined1  [8])pBVar23->next;
        pBVar23->next = pBVar30;
        pBVar30 = pBVar23;
      } while (auStack_98 != (undefined1  [8])0x0);
      *(BVSparseNode **)&deadSymsBv.lastFoundIndex[5].startIndex = pBVar23;
    }
  }
  return;
}

Assistant:

void
BasicBlock::CleanUpValueMaps()
{
    // Don't do cleanup if it's been done recently.
    // Landing pad could get optimized twice...
    // We want the same info out the first and second time. So always cleanup.
    // Increasing the cleanup threshold count for asmjs to 500
    uint cleanupCount = (!this->globOptData.globOpt->GetIsAsmJSFunc()) ? CONFIG_FLAG(GoptCleanupThreshold) : CONFIG_FLAG(AsmGoptCleanupThreshold);
    if (!this->IsLandingPad() && this->globOptData.globOpt->instrCountSinceLastCleanUp < cleanupCount)
    {
        return;
    }
    this->globOptData.globOpt->instrCountSinceLastCleanUp = 0;

    JitArenaAllocator* tempAlloc = this->globOptData.globOpt->tempAlloc;

    GlobHashTable *thisTable = this->globOptData.symToValueMap;
    BVSparse<JitArenaAllocator> deadSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> keepAliveSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> availableValueNumbers(tempAlloc);
    availableValueNumbers.Copy(this->globOptData.globOpt->byteCodeConstantValueNumbersBv);
    BVSparse<JitArenaAllocator> *upwardExposedUses = this->upwardExposedUses;
    BVSparse<JitArenaAllocator> *upwardExposedFields = this->upwardExposedFields;
    bool isInLoop = !!this->loop;

    BVSparse<JitArenaAllocator> symsInCallSequence(tempAlloc);
    SListBase<IR::Opnd *> * callSequence = this->globOptData.callSequence;
    if (callSequence && !callSequence->Empty())
    {
        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, callSequence)
        {
            StackSym * sym = opnd->GetStackSym();
            symsInCallSequence.Set(sym->m_id);
        }
    }
    NEXT_SLISTBASE_ENTRY;

    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            Sym * sym = bucket.value;
            bool isSymUpwardExposed = upwardExposedUses->Test(sym->m_id) || upwardExposedFields->Test(sym->m_id);
            if (!isSymUpwardExposed && symsInCallSequence.Test(sym->m_id))
            {
                // Don't remove/shrink sym-value pair if the sym is referenced in callSequence even if the sym is dead according to backward data flow.
                // This is possible in some edge cases that an infinite loop is involved when evaluating parameter for a function (between StartCall and Call),
                // there is no backward data flow into the infinite loop block, but non empty callSequence still populates to it in this (forward) pass
                // which causes error when looking up value for the syms in callSequence (cannot find the value).
                // It would cause error to fill out the bailout information for the loop blocks.
                // Remove dead syms from callSequence has some risk because there are various associated counters which need to be consistent.
                continue;
            }
            // Make sure symbol was created before backward pass.
            // If symbols isn't upward exposed, mark it as dead.
            // If a symbol was copy-prop'd in a loop prepass, the upwardExposedUses info could be wrong.  So wait until we are out of the loop before clearing it.
            bool isSymFieldPRESymStore = isInLoop && this->loop->fieldPRESymStores->Test(sym->m_id);
            if ((SymID)sym->m_id <= this->globOptData.globOpt->maxInitialSymID && !isSymUpwardExposed && !isSymFieldPRESymStore
                && (!isInLoop || !this->globOptData.globOpt->prePassCopyPropSym->Test(sym->m_id)))
            {
                Value *val = bucket.element;
                ValueInfo *valueInfo = val->GetValueInfo();

                Sym *symStore = valueInfo->GetSymStore();

                if (symStore && symStore == sym)
                {
                    // Keep constants around, as we don't know if there will be further uses
                    if (!bucket.element->GetValueInfo()->IsVarConstant() && !bucket.element->GetValueInfo()->HasIntConstantValue())
                    {
                        // Symbol may still be a copy-prop candidate.  Wait before deleting it.
                        deadSymsBv.Set(sym->m_id);

                        // Make sure the type sym is added to the dead syms vector as well, because type syms are
                        // created in backward pass and so their symIds > maxInitialSymID.
                        if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                        {
                            deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
                else
                {
                    // Make sure the type sym is added to the dead syms vector as well, because type syms are
                    // created in backward pass and so their symIds > maxInitialSymID. Perhaps we could remove
                    // it explicitly here, but would it work alright with the iterator?
                    if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                    {
                        deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                    }

                    // Not a copy-prop candidate; delete it right away.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                    this->globOptData.SetChangedSym(sym);
                }
            }
            else
            {
                if (sym->IsPropertySym() && !this->globOptData.liveFields->Test(sym->m_id))
                {
                    // Remove propertySyms which are not live anymore.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                }
                else
                {
                    // Look at the copy-prop candidate. We don't want to get rid of the data for a symbol which is
                    // a copy-prop candidate.
                    Value *val = bucket.element;
                    ValueInfo *valueInfo = val->GetValueInfo();

                    Sym *symStore = valueInfo->GetSymStore();

                    if (symStore && symStore != sym)
                    {
                        keepAliveSymsBv.Set(symStore->m_id);
                        if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                        {
                            keepAliveSymsBv.Set(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    deadSymsBv.Minus(&keepAliveSymsBv);

    // Now cleanup exprToValueMap table
    ExprHashTable *thisExprTable = this->globOptData.exprToValueMap;
    bool oldHasCSECandidatesValue = this->globOptData.hasCSECandidates;  // Could be false if none need bailout.
    this->globOptData.hasCSECandidates = false;

    for (uint i = 0; i < thisExprTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(ExprHashBucket, bucket, &thisExprTable->table[i], iter)
        {
            ExprHash hash = bucket.value;
            ValueNumber src1ValNum = hash.GetSrc1ValueNumber();
            ValueNumber src2ValNum = hash.GetSrc2ValueNumber();

            // If src1Val or src2Val are not available anymore, no point keeping this CSE candidate
            bool removeCurrent = false;
            if ((src1ValNum && !availableValueNumbers.Test(src1ValNum))
                || (src2ValNum && !availableValueNumbers.Test(src2ValNum)))
            {
                removeCurrent = true;
            }
            else
            {
                // If we are keeping this value, make sure we also keep the symStore in the value table
                removeCurrent = true; // Remove by default, unless it's set to false later below.
                Value *val = bucket.element;
                if (val)
                {
                    Sym *symStore = val->GetValueInfo()->GetSymStore();
                    if (symStore)
                    {
                        Value *symStoreVal = this->globOptData.FindValue(symStore);

                        if (symStoreVal && symStoreVal->GetValueNumber() == val->GetValueNumber())
                        {
                            removeCurrent = false;
                            deadSymsBv.Clear(symStore->m_id);
                            if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                            {
                                deadSymsBv.Clear(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                            }
                        }
                    }
                }
            }

            if(removeCurrent)
            {
                iter.RemoveCurrent(thisExprTable->alloc);
            }
            else
            {
                this->globOptData.hasCSECandidates = oldHasCSECandidatesValue;
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    FOREACH_BITSET_IN_SPARSEBV(dead_id, &deadSymsBv)
    {
        thisTable->Clear(dead_id);
        Sym* sym = this->func->m_symTable->Find(dead_id);
        this->globOptData.SetChangedSym(sym);
    }
    NEXT_BITSET_IN_SPARSEBV;

    if (!deadSymsBv.IsEmpty())
    {
        if (this->func->IsJitInDebugMode())
        {
            // Do not remove non-temp local vars from liveVarSyms (i.e. do not let them become dead).
            // We will need to restore all initialized/used so far non-temp local during bail out.
            // (See BackwardPass::ProcessBailOutInfo)
            Assert(this->func->m_nonTempLocalVars);
            BVSparse<JitArenaAllocator> tempBv(tempAlloc);
            tempBv.Minus(&deadSymsBv, this->func->m_nonTempLocalVars);
            this->globOptData.liveVarSyms->Minus(&tempBv);
#if DBG
            tempBv.And(this->globOptData.liveInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?");
            tempBv.And(this->globOptData.liveLossyInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?");
            tempBv.And(this->globOptData.liveFloat64Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?");
#endif
        }
        else
        {
            this->globOptData.liveVarSyms->Minus(&deadSymsBv);
        }

        this->globOptData.liveInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveLossyInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveFloat64Syms->Minus(&deadSymsBv);
    }

    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedUses);
    this->upwardExposedUses = nullptr;
    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedFields);
    this->upwardExposedFields = nullptr;
    if (this->cloneStrCandidates)
    {
        JitAdelete(this->globOptData.globOpt->alloc, this->cloneStrCandidates);
        this->cloneStrCandidates = nullptr;
    }
}